

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

void StartEventThrd(ALCcontext *ctx)

{
  ALCcontext *in_RDI;
  thread local_18;
  ALCcontext *local_10;
  
  local_10 = in_RDI;
  std::thread::thread<int(&)(ALCcontext*),ALCcontext*&,void>(&local_18,EventThread,&local_10);
  if ((local_10->mEventThread)._M_id._M_thread == 0) {
    (local_10->mEventThread)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void StartEventThrd(ALCcontext *ctx)
{
    try {
        ctx->mEventThread = std::thread{EventThread, ctx};
    }
    catch(std::exception& e) {
        ERR("Failed to start event thread: %s\n", e.what());
    }
    catch(...) {
        ERR("Failed to start event thread! Expect problems.\n");
    }
}